

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

int __thiscall Timidity::Renderer::allocate_voice(Renderer *this)

{
  float fVar1;
  float fVar2;
  float local_24;
  float v;
  float lv;
  int lowest;
  int i;
  Renderer *this_local;
  
  lv = 0.0;
  while( true ) {
    if (this->voices <= (int)lv) {
      v = -NAN;
      local_24 = 1e+10;
      lv = (float)this->voices;
      while (fVar2 = (float)((int)lv + -1), lv != 0.0) {
        lv = fVar2;
        if ((((this->voice[(int)fVar2].status & 4) != 0) &&
            ((this->voice[(int)fVar2].status & 8) == 0)) &&
           (fVar1 = this->voice[(int)fVar2].attenuation, fVar1 < local_24)) {
          local_24 = fVar1;
          v = fVar2;
        }
      }
      if ((int)v < 0) {
        this->lost_notes = this->lost_notes + 1;
      }
      else {
        this->cut_notes = this->cut_notes + 1;
        this->voice[(int)v].status = '\0';
      }
      return (int)v;
    }
    if ((this->voice[(int)lv].status & 1) == 0) break;
    lv = (float)((int)lv + 1);
  }
  return (int)lv;
}

Assistant:

int Renderer::allocate_voice()
{
	int i, lowest;
	float lv, v;

	for (i = 0; i < voices; ++i)
	{
		if (!(voice[i].status & VOICE_RUNNING))
		{
			return i; /* Can't get a lower volume than silence */
		}
	}

	/* Look for the decaying note with the lowest volume */
	lowest = -1;
	lv = 1e10;
	i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RELEASING) && !(voice[i].status & VOICE_STOPPING))
		{
			v = voice[i].attenuation;
			if (v < lv)
			{
				lv = v;
				lowest = i;
			}
		}
	}

	if (lowest >= 0)
	{
		/* This can still cause a click, but if we had a free voice to
		   spare for ramping down this note, we wouldn't need to kill it
		   in the first place... Still, this needs to be fixed. Perhaps
		   we could use a reserve of voices to play dying notes only. */

		cut_notes++;
		voice[lowest].status = 0;
	}
	else
	{
		lost_notes++;
	}
	return lowest;
}